

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Grequest_start
              (MPIABI_Grequest_query_function *query_fn,undefined1 *free_fn,
              MPIABI_Grequest_cancel_function *cancel_fn,void *extra_state,MPIABI_Request *request)

{
  int iVar1;
  undefined8 *puVar2;
  ompi_request_t **ppoVar3;
  WPI_HandlePtr<ompi_request_t_*> local_48;
  int local_3c;
  undefined8 *puStack_38;
  int ierr;
  grequest_state_t *grequest_state;
  MPIABI_Request *request_local;
  void *extra_state_local;
  MPIABI_Grequest_cancel_function *cancel_fn_local;
  undefined1 *free_fn_local;
  MPIABI_Grequest_query_function *query_fn_local;
  
  grequest_state = (grequest_state_t *)request;
  request_local = (MPIABI_Request *)extra_state;
  extra_state_local = cancel_fn;
  cancel_fn_local = (MPIABI_Grequest_cancel_function *)free_fn;
  free_fn_local = query_fn;
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = free_fn_local;
  puVar2[1] = cancel_fn_local;
  puVar2[2] = extra_state_local;
  puVar2[3] = request_local;
  puStack_38 = puVar2;
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_48,(uintptr_t *)grequest_state);
  ppoVar3 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_48);
  iVar1 = MPI_Grequest_start(anon_unknown.dwarf_28f2::forward_query_fn,
                             anon_unknown.dwarf_28f2::forward_free_fn,
                             anon_unknown.dwarf_28f2::forward_cancel_fn,puVar2,ppoVar3);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_48);
  local_3c = iVar1;
  if ((iVar1 != 0) && (puStack_38 != (undefined8 *)0x0)) {
    operator_delete(puStack_38);
  }
  return local_3c;
}

Assistant:

int MPIABI_Grequest_start(MPIABI_Grequest_query_function *query_fn,
                                     MPIABI_Grequest_free_function *free_fn,
                                     MPIABI_Grequest_cancel_function *cancel_fn,
                                     void *extra_state,
                                     MPIABI_Request *request) {
  grequest_state_t *const grequest_state =
      new grequest_state_t{query_fn, free_fn, cancel_fn, extra_state};
  const int ierr =
      MPI_Grequest_start(forward_query_fn, forward_free_fn, forward_cancel_fn,
                         grequest_state, (WPI_RequestPtr)request);
  if (ierr != MPI_SUCCESS)
    delete grequest_state;
  return ierr;
}